

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

int add_hd_table_incremental
              (nghttp2_hd_context *context,nghttp2_hd_nv *nv,nghttp2_hd_map *map,uint32_t hash)

{
  uint32_t uVar1;
  size_t sVar2;
  size_t sVar3;
  nghttp2_hd_entry *ent_00;
  uint32_t in_ECX;
  nghttp2_hd_map *in_RDX;
  long *in_RSI;
  long in_RDI;
  nghttp2_hd_entry *ent;
  size_t idx;
  nghttp2_mem *mem;
  size_t room;
  nghttp2_hd_entry *new_ent;
  int rv;
  uint7 in_stack_ffffffffffffffa8;
  undefined1 uVar4;
  nghttp2_hd_entry *in_stack_ffffffffffffffb0;
  nghttp2_hd_ringbuf *in_stack_ffffffffffffffb8;
  int local_4;
  
  sVar2 = entry_room(*(size_t *)(*in_RSI + 0x18),*(size_t *)(in_RSI[1] + 0x18));
  while( true ) {
    uVar4 = false;
    if (*(ulong *)(in_RDI + 0x30) < *(long *)(in_RDI + 0x28) + sVar2) {
      uVar4 = *(long *)(in_RDI + 0x18) != 0;
    }
    if ((bool)uVar4 == false) break;
    in_stack_ffffffffffffffb8 = (nghttp2_hd_ringbuf *)(*(long *)(in_RDI + 0x18) + -1);
    in_stack_ffffffffffffffb0 =
         hd_ringbuf_get((nghttp2_hd_ringbuf *)in_stack_ffffffffffffffb0,
                        CONCAT17(uVar4,in_stack_ffffffffffffffa8));
    sVar3 = entry_room(((in_stack_ffffffffffffffb0->nv).name)->len,
                       ((in_stack_ffffffffffffffb0->nv).value)->len);
    *(size_t *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) - sVar3;
    hd_ringbuf_pop_back((nghttp2_hd_ringbuf *)0x125428);
    if (in_RDX != (nghttp2_hd_map *)0x0) {
      hd_map_remove(in_RDX,in_stack_ffffffffffffffb0);
    }
    nghttp2_hd_entry_free((nghttp2_hd_entry *)0x125449);
    nghttp2_mem_free((nghttp2_mem *)in_stack_ffffffffffffffb0,
                     (void *)CONCAT17(uVar4,in_stack_ffffffffffffffa8));
  }
  if (*(ulong *)(in_RDI + 0x30) < sVar2) {
    local_4 = 0;
  }
  else {
    ent_00 = (nghttp2_hd_entry *)
             nghttp2_mem_malloc((nghttp2_mem *)in_stack_ffffffffffffffb0,
                                (ulong)in_stack_ffffffffffffffa8);
    if (ent_00 == (nghttp2_hd_entry *)0x0) {
      local_4 = -0x385;
    }
    else {
      nghttp2_hd_entry_init
                (in_stack_ffffffffffffffb0,
                 (nghttp2_hd_nv *)CONCAT17(uVar4,in_stack_ffffffffffffffa8));
      local_4 = hd_ringbuf_push_front
                          (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                           (nghttp2_mem *)CONCAT17(uVar4,in_stack_ffffffffffffffa8));
      if (local_4 == 0) {
        uVar1 = *(uint32_t *)(in_RDI + 0x38);
        *(uint32_t *)(in_RDI + 0x38) = uVar1 + 1;
        ent_00->seq = uVar1;
        ent_00->hash = in_ECX;
        if (in_RDX != (nghttp2_hd_map *)0x0) {
          hd_map_insert(in_RDX,ent_00);
        }
        *(size_t *)(in_RDI + 0x28) = sVar2 + *(long *)(in_RDI + 0x28);
        local_4 = 0;
      }
      else {
        nghttp2_hd_entry_free((nghttp2_hd_entry *)0x1254db);
        nghttp2_mem_free((nghttp2_mem *)in_stack_ffffffffffffffb0,
                         (void *)CONCAT17(uVar4,in_stack_ffffffffffffffa8));
      }
    }
  }
  return local_4;
}

Assistant:

static int add_hd_table_incremental(nghttp2_hd_context *context,
                                    nghttp2_hd_nv *nv, nghttp2_hd_map *map,
                                    uint32_t hash) {
  int rv;
  nghttp2_hd_entry *new_ent;
  size_t room;
  nghttp2_mem *mem;

  mem = context->mem;
  room = entry_room(nv->name->len, nv->value->len);

  while (context->hd_table_bufsize + room > context->hd_table_bufsize_max &&
         context->hd_table.len > 0) {
    size_t idx = context->hd_table.len - 1;
    nghttp2_hd_entry *ent = hd_ringbuf_get(&context->hd_table, idx);

    context->hd_table_bufsize -=
      entry_room(ent->nv.name->len, ent->nv.value->len);

    DEBUGF("hpack: remove item from header table: %s: %s\n",
           (char *)ent->nv.name->base, (char *)ent->nv.value->base);

    hd_ringbuf_pop_back(&context->hd_table);
    if (map) {
      hd_map_remove(map, ent);
    }

    nghttp2_hd_entry_free(ent);
    nghttp2_mem_free(mem, ent);
  }

  if (room > context->hd_table_bufsize_max) {
    /* The entry taking more than NGHTTP2_HD_MAX_BUFFER_SIZE is
       immediately evicted.  So we don't allocate memory for it. */
    return 0;
  }

  new_ent = nghttp2_mem_malloc(mem, sizeof(nghttp2_hd_entry));
  if (new_ent == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_hd_entry_init(new_ent, nv);

  rv = hd_ringbuf_push_front(&context->hd_table, new_ent, mem);

  if (rv != 0) {
    nghttp2_hd_entry_free(new_ent);
    nghttp2_mem_free(mem, new_ent);

    return rv;
  }

  new_ent->seq = context->next_seq++;
  new_ent->hash = hash;

  if (map) {
    hd_map_insert(map, new_ent);
  }

  context->hd_table_bufsize += room;

  return 0;
}